

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

string * tyhp_make_real_url(string *__return_storage_ptr__,string *url)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string url2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = &bStack_78;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  url2._M_dataplus._M_p = (pointer)&url2.field_2;
  url2._M_string_length = 0;
  url2.field_2._M_local_buf[0] = '\0';
  iVar1 = std::__cxx11::string::find((string *)url,0x10d438);
  if (iVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)&url2);
  }
  else {
    std::__cxx11::string::substr((ulong)&bStack_78,(ulong)url);
    std::__cxx11::string::operator=((string *)&url2,(string *)&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  if (tyhp_docroot_abi_cxx11_._M_dataplus._M_p[tyhp_docroot_abi_cxx11_._M_string_length - 1] == '/')
  {
    if (*url2._M_dataplus._M_p == '/') {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::erase((ulong)&url2,0);
      std::operator+(&bStack_78,&tyhp_docroot_abi_cxx11_,__rhs);
    }
    else {
      std::operator+(&bStack_78,&tyhp_docroot_abi_cxx11_,&url2);
    }
  }
  else {
    if (*url2._M_dataplus._M_p != '/') {
      std::operator+(&local_38,&tyhp_docroot_abi_cxx11_,'/');
      std::operator+(&bStack_78,&local_38,&url2);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
      std::__cxx11::string::~string((string *)&bStack_78);
      this = &local_38;
      goto LAB_0010877e;
    }
    std::operator+(&bStack_78,&tyhp_docroot_abi_cxx11_,&url2);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
LAB_0010877e:
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&url2);
  return __return_storage_ptr__;
}

Assistant:

string tyhp_make_real_url(const string& url)
{
	string real_url, url2;

	int n = 0;
	
	if((n = url.find(tyhp_domain, 0)) != string::npos)//url中包含域名，要将其删去
		url2 = url.substr(tyhp_domain.size(), url.size() - tyhp_domain.size());
	else
		url2 = url;

	if(tyhp_docroot[tyhp_docroot.size() - 1] == '/')//配置项docroot末尾有'/'
	{
		if(url2[0] == '/')
			real_url = tyhp_docroot + url2.erase(0, 1);
		else
			real_url = tyhp_docroot + url2;
	}
	else//配置项docroot末尾没有'\'
	{
		if(url2[0] == '/')
			real_url = tyhp_docroot + url2;
		else
			real_url = tyhp_docroot + '/' + url2;
	}

	return real_url;
}